

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

void __thiscall
pstore::index::
hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
::hamt_map(hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
           *this,database *db,typed_address<pstore::index::header_block> pos,
          fnv_64a_hash_indirect_string *hash,equal_to<pstore::indirect_string> *equal)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  shared_ptr<const_pstore::index::header_block> hb;
  
  (this->super_index_base)._vptr_index_base = (_func_int **)&PTR__hamt_map_00135d30;
  std::
  make_unique<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>>();
  uVar4 = database::get_current_revision(db);
  this->revision_ = uVar4;
  (this->root_).internal_ = (internal_node *)0x0;
  this->size_ = 0;
  if (pos.a_.a_ != 0) {
    database::getro<pstore::index::header_block,void>
              ((database *)&hb,(typed_address<pstore::index::header_block>)db);
    bVar3 = std::operator!=(&(hb.
                              super___shared_ptr<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->signature,
                            (array<unsigned_char,_8UL> *)
                            &hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
                             ::index_signature);
    if (bVar3) {
      raise<pstore::error_code>(index_corrupt);
    }
    uVar1 = ((hb.super___shared_ptr<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->root).a_;
    if ((uVar1 & 2) != 0) {
LAB_00108b46:
      raise<pstore::error_code>(index_corrupt);
    }
    sVar2 = (hb.super___shared_ptr<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->size;
    if (sVar2 == 0) {
      if (uVar1 != 0) goto LAB_00108b46;
    }
    else if ((uVar1 == 0) || ((sVar2 == 1) != ((uVar1 & 1) == 0))) goto LAB_00108b46;
    this->size_ = sVar2;
    this->root_ = (index_pointer)
                  ((hb.
                    super___shared_ptr<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->root).a_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&hb.super___shared_ptr<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

hamt_map<KeyType, ValueType, Hash, KeyEqual>::hamt_map (
            database const & db, typed_address<header_block> const pos, Hash const & hash,
            KeyEqual const & equal)
                : internals_container_{std::make_unique<internal_nodes_container> ()}
                , revision_{db.get_current_revision ()}
                , hash_{hash}
                , equal_{equal} {

            if (pos != typed_address<header_block>::null ()) {
                // 'pos' points to the index header block which gives us the tree root and size.
                std::shared_ptr<header_block const> const hb = db.getro (pos);
                // Check that this block appears to be sensible.
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (hb->signature != index_signature) {
                    raise (pstore::error_code::index_corrupt);
                }
#endif

                {
                    auto const root = index_pointer{hb->root};
                    if (root.is_heap () || (hb->size == 0U && !root.is_empty ()) ||
                        (hb->size > 0U && root.is_empty ()) ||
                        (hb->size == 1U && !root.is_leaf ()) ||
                        (hb->size > 1U && !root.is_internal ())) {

                        raise (pstore::error_code::index_corrupt);
                    }
                }
                size_ = hb->size;
                root_ = hb->root;
            }
        }